

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module_name.cpp
# Opt level: O3

void __thiscall sc_core::sc_module_name::~sc_module_name(sc_module_name *this)

{
  sc_module_name *psVar1;
  
  if (this->m_pushed == true) {
    psVar1 = sc_object_manager::pop_module_name(this->m_simc->m_object_manager);
    if (psVar1 != this) {
      sc_report_handler::report
                (SC_ERROR,"incorrect use of sc_module_name",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_module_name.cpp"
                 ,0x3f);
    }
    if (this->m_module_p != (sc_module *)0x0) {
      sc_module::end_module(this->m_module_p);
      return;
    }
  }
  return;
}

Assistant:

sc_module_name::~sc_module_name()
{
    if( m_pushed ) {
        sc_module_name* smn = m_simc->get_object_manager()->pop_module_name();
        if( this != smn ) {
            SC_REPORT_ERROR( SC_ID_SC_MODULE_NAME_USE_, 0 );
        }
	if ( m_module_p ) m_module_p->end_module();
    }
}